

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

void __thiscall Socket::setLocalSocket(Socket *this,string *ipaddr,int port)

{
  int iVar1;
  runtime_error *this_00;
  sockaddr_in localSockAddr;
  undefined1 local_28 [8];
  char acStack_20 [16];
  
  acStack_20[0] = '\0';
  acStack_20[1] = '\0';
  acStack_20[2] = '\0';
  acStack_20[3] = '\0';
  acStack_20[4] = '\0';
  acStack_20[5] = '\0';
  acStack_20[6] = '\0';
  acStack_20[7] = '\0';
  local_28._2_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_28._0_2_ = 2;
  local_28._4_4_ = 0;
  iVar1 = inet_aton((ipaddr->_M_dataplus)._M_p,(in_addr *)(local_28 + 4));
  if (iVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"setLocalSocket() - invalid ip address");
  }
  else {
    iVar1 = bind(this->SocketFileDescriptor,(sockaddr *)local_28,0x10);
    if (iVar1 == 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"setLocalSocket(): bind failed, is port already in use?");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::setLocalSocket(const std::string ipaddr, int port) {
  // zero out the structures
  struct sockaddr_in localSockAddr;
  std::memset((char *)&localSockAddr, 0, sizeof(localSockAddr));
  localSockAddr.sin_family = AF_INET;
  localSockAddr.sin_port = htons(port);

  int ret = inet_aton(ipaddr.c_str(), &localSockAddr.sin_addr);
  if (ret == 0) {
    throw std::runtime_error("setLocalSocket() - invalid ip address");
  }

  // bind socket to port
  ret = bind(SocketFileDescriptor, (struct sockaddr *)&localSockAddr, sizeof(localSockAddr));
  if (ret != 0) {
    throw std::runtime_error("setLocalSocket(): bind failed, is port already in use?");
  }
}